

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::TestInfo::~TestInfo(TestInfo *this)

{
  if (this->factory_ != (TestFactoryBase *)0x0) {
    (*this->factory_->_vptr_TestFactoryBase[1])();
  }
  TestResult::~TestResult(&this->result_);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&this->value_param_);
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&this->type_param_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestInfo::~TestInfo() { delete factory_; }